

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar11;
  pointer pcVar12;
  byte bVar13;
  double dVar14;
  pointer pMVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  undefined8 uVar19;
  IVal *pIVar20;
  undefined8 *puVar21;
  long lVar22;
  long lVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  IVal *ival;
  _Base_ptr p_Var25;
  FloatFormat *pFVar26;
  byte bVar27;
  TestStatus *pTVar28;
  IVal in2;
  IVal reference1;
  IVal in3;
  FuncSet funcs;
  Environment env;
  IVal in0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  undefined4 auStackY_5f8 [2];
  undefined8 uStackY_5f0;
  _Alloc_hider in_stack_fffffffffffffa18;
  _Alloc_hider _Var29;
  size_type sStack_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  IVal local_5b9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b8;
  size_t local_5b0;
  ulong local_5a8;
  long local_5a0;
  TestStatus *local_598;
  FloatFormat *local_590;
  long local_588;
  string local_580;
  undefined1 local_560 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  _Rb_tree_node_base *local_540;
  double local_538;
  long local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  undefined1 local_468 [12];
  YesNoMaybe YStack_45c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  double local_448;
  Precision local_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_438;
  undefined4 local_430;
  char acStack_408 [8];
  double dStack_400;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [112];
  undefined8 local_138 [33];
  
  this_00 = this->m_samplings;
  pFVar26 = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  uStackY_5f0 = 0x8e3ea6;
  local_598 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  uStackY_5f0 = 0x8e3ecd;
  local_590 = pFVar26;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,4,2>,tcu::Matrix<float,4,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar26,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar17 + 0xdeadbeef),
             (deUint32)SUB84(in_stack_fffffffffffffa18._M_p,0));
  pMVar15 = local_278.in0.
            super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_5b0 = (long)local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  uStackY_5f0 = 0x8e3ef1;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_2e8,local_5b0);
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStackY_5f0 = 0x8e3f47;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_5b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_468 + 8);
  uStackY_5f0 = 0x8e3fcb;
  local_468._0_8_ = local_5b8;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  uStackY_5f0 = 0x8e3fdf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  uStackY_5f0 = 0x8e3ff5;
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  uStackY_5f0 = 0x8e4009;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  uStackY_5f0 = 0x8e4018;
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  uStackY_5f0 = 0x8e4025;
  std::ios_base::~ios_base(local_3f8 + 8);
  uStackY_5f0 = 0x8e4032;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var5 = (_Rb_tree_node_base *)(local_560 + 8);
  local_560._8_4_ = _S_red;
  local_550._M_allocated_capacity = 0;
  local_538 = 0.0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  uStackY_5f0 = 0x8e4068;
  local_550._8_8_ = p_Var5;
  local_540 = p_Var5;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_560);
  if ((_Rb_tree_node_base *)local_550._8_8_ != p_Var5) {
    uVar19 = local_550._8_8_;
    do {
      uStackY_5f0 = 0x8e408a;
      (**(code **)(**(long **)(uVar19 + 0x20) + 0x30))(*(long **)(uVar19 + 0x20),local_1a8);
      uStackY_5f0 = 0x8e4092;
      uVar19 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar19);
    } while ((_Rb_tree_node_base *)uVar19 != p_Var5);
  }
  if (local_538 != 0.0) {
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_5b8;
    uStackY_5f0 = 0x8e40c2;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    uStackY_5f0 = 0x8e40d6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    uStackY_5f0 = 0x8e40e6;
    std::__cxx11::stringbuf::str();
    uStackY_5f0 = 0x8e40f7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,in_stack_fffffffffffffa18._M_p,sStack_5e0);
    uStackY_5f0 = 0x8e410b;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffa18._M_p != &local_5d8) {
      uStackY_5f0 = 0x8e4126;
      operator_delete(in_stack_fffffffffffffa18._M_p,local_5d8._M_allocated_capacity + 1);
    }
    uStackY_5f0 = 0x8e4135;
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    uStackY_5f0 = 0x8e4142;
    std::ios_base::~ios_base(local_3f8 + 8);
  }
  uStackY_5f0 = 0x8e414f;
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_560);
  uStackY_5f0 = 0x8e4163;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  uStackY_5f0 = 0x8e4170;
  std::ios_base::~ios_base((ios_base *)local_138);
  pSVar10 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  uStackY_5f0 = 0x8e4195;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_5b0,&local_218,&local_288,0);
  uStackY_5f0 = 0x8e41a2;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_468);
  uStackY_5f0 = 0x8e41af;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_1a8);
  uStackY_5f0 = 0x8e41bc;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_560);
  uStackY_5f0 = 0x8e41d8;
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.m_ptr,
             (IVal *)local_468);
  uStackY_5f0 = 0x8e41f4;
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  uStackY_5f0 = 0x8e420b;
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa18);
  uStackY_5f0 = 0x8e4224;
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_580);
  uStackY_5f0 = 0x8e4240;
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.m_ptr,
             (IVal *)local_560);
  uStackY_5f0 = 0x8e425c;
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_5b9);
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar15) {
LAB_008e4be8:
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_5b8;
    uStackY_5f0 = 0x8e4c01;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    uStackY_5f0 = 0x8e4c15;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar28 = local_598;
    uStackY_5f0 = 0x8e4c27;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    uStackY_5f0 = 0x8e4c3b;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    uStackY_5f0 = 0x8e4c4f;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    uStackY_5f0 = 0x8e4c5e;
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    uStackY_5f0 = 0x8e4c6b;
    std::ios_base::~ios_base(local_3f8 + 8);
    uStackY_5f0 = 0x8e4c92;
    local_468._0_8_ = &local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar28->m_code = QP_TEST_RESULT_PASS;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    uStackY_5f0 = 0x8e4cbd;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_468._0_8_,
               (char *)(local_468._0_8_ + CONCAT44(YStack_45c,local_468._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ == &local_458) goto LAB_008e4dcd;
    uVar19 = (_Base_ptr)
             CONCAT44(local_458._M_allocated_capacity._4_4_,local_458._M_allocated_capacity._0_4_);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._0_8_;
  }
  else {
    local_4a0 = local_5b0 + (local_5b0 == 0);
    local_588 = 0;
    local_5a0 = 0;
    local_5a8 = 0;
    pFVar26 = local_590;
    do {
      uStackY_5f0 = 0x8e42b7;
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_1a8);
      lVar23 = local_588;
      local_5d8._M_allocated_capacity = 0;
      local_5d8._8_4_ = 0.0;
      local_5d8._12_4_ = 0.0;
      lVar22 = 4;
      do {
        auStackY_5f8[lVar22] =
             *(undefined4 *)
              ((long)(((local_278.in0.
                        super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data + -1) +
              lVar22 * 4 + local_588);
        *(undefined4 *)(&stack0xfffffffffffffa18 + lVar22 * 4) =
             *(undefined4 *)
              ((long)((local_278.in0.
                       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
              lVar22 * 4 + local_588);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 8);
      uStackY_5f0 = 0x8e4305;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                ((IVal *)local_560,pFVar26,(Matrix<float,_4,_2> *)&stack0xfffffffffffffa18);
      uStackY_5f0 = 0x8e4318;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_468,pFVar26,(IVal *)local_560);
      uStackY_5f0 = 0x8e4327;
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_498,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      lVar22 = 0;
      do {
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar22) =
             *(undefined8 *)(local_458._M_local_buf + lVar22);
        dVar14 = *(double *)(local_468 + lVar22 + 8);
        pbVar2 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar22;
        *(undefined8 *)pbVar2 = *(undefined8 *)(local_468 + lVar22);
        *(double *)(pbVar2 + 8) = dVar14;
        dVar14 = *(double *)(local_458._M_local_buf + lVar22 + 0x58);
        pbVar2 = &(pIVar20->m_data).m_data[1].m_data[0].m_hasNaN + lVar22;
        *(undefined8 *)pbVar2 = *(undefined8 *)(local_458._M_local_buf + lVar22 + 0x50);
        *(double *)(pbVar2 + 8) = dVar14;
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[1].m_data[0].m_hi + lVar22) =
             *(undefined8 *)(local_458._M_local_buf + lVar22 + 0x60);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x60);
      local_5d8._M_allocated_capacity = 0;
      local_5d8._8_4_ = 0.0;
      local_5d8._12_4_ = 0.0;
      _Var29._M_p = (pointer)0x0;
      lVar22 = 4;
      do {
        auStackY_5f8[lVar22] =
             *(undefined4 *)
              ((long)(((local_278.in1.
                        super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data + -1) +
              lVar22 * 4 + lVar23);
        *(undefined4 *)(&stack0xfffffffffffffa18 + lVar22 * 4) =
             *(undefined4 *)
              ((long)((local_278.in1.
                       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
              lVar22 * 4 + lVar23);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 8);
      uStackY_5f0 = 0x8e43af;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                ((IVal *)local_560,pFVar26,(Matrix<float,_4,_2> *)&stack0xfffffffffffffa18);
      uStackY_5f0 = 0x8e43c5;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_468,pFVar26,(IVal *)local_560);
      uStackY_5f0 = 0x8e43d4;
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_498,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      lVar23 = 0;
      do {
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar23) =
             *(undefined8 *)(local_458._M_local_buf + lVar23);
        dVar14 = *(double *)(local_468 + lVar23 + 8);
        pbVar2 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar23;
        *(undefined8 *)pbVar2 = *(undefined8 *)(local_468 + lVar23);
        *(double *)(pbVar2 + 8) = dVar14;
        dVar14 = *(double *)(local_458._M_local_buf + lVar23 + 0x58);
        pbVar2 = &(pIVar20->m_data).m_data[1].m_data[0].m_hasNaN + lVar23;
        *(undefined8 *)pbVar2 = *(undefined8 *)(local_458._M_local_buf + lVar23 + 0x50);
        *(double *)(pbVar2 + 8) = dVar14;
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[1].m_data[0].m_hi + lVar23) =
             *(undefined8 *)(local_458._M_local_buf + lVar23 + 0x60);
        lVar23 = lVar23 + 0x18;
      } while (lVar23 != 0x60);
      uStackY_5f0 = 0x8e4422;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      uStackY_5f0 = 0x8e4431;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_440 = (this->m_caseCtx).precision;
      local_448 = pFVar26->m_maxValue;
      local_468._0_8_ = *(undefined8 *)pFVar26;
      local_468._8_4_ = pFVar26->m_fractionBits;
      YStack_45c = pFVar26->m_hasSubnormal;
      local_458._M_allocated_capacity._0_4_ = pFVar26->m_hasInf;
      local_458._M_allocated_capacity._4_4_ = pFVar26->m_hasNaN;
      local_458._8_1_ = pFVar26->m_exactPrecision;
      local_458._9_3_ = *(undefined3 *)&pFVar26->field_0x19;
      local_458._12_4_ = *(undefined4 *)&pFVar26->field_0x1c;
      local_430 = 0;
      pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      uStackY_5f0 = 0x8e448a;
      local_438 = &local_498;
      (*pSVar9->_vptr_Statement[3])(pSVar9,(IVal *)local_468);
      uStackY_5f0 = 0x8e4499;
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_498,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      uStackY_5f0 = 0x8e44ac;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_468,&local_2b8,pIVar20);
      pMVar15 = local_2e8.out0.
                super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar23 = local_5a0;
      lVar22 = 0;
      do {
        *(undefined8 *)(local_1a8 + lVar22 + 0x10) =
             *(undefined8 *)(local_458._M_local_buf + lVar22);
        uVar19 = *(undefined8 *)(local_468 + lVar22 + 8);
        *(undefined8 *)(local_1a8 + lVar22) = *(undefined8 *)(local_468 + lVar22);
        *(undefined8 *)(local_1a8 + lVar22 + 8) = uVar19;
        uVar19 = *(undefined8 *)(local_458._M_local_buf + lVar22 + 0x58);
        *(undefined8 *)(local_1a8 + lVar22 + 0x60) =
             *(undefined8 *)(local_458._M_local_buf + lVar22 + 0x50);
        *(undefined8 *)(local_1a8 + lVar22 + 0x68) = uVar19;
        *(undefined8 *)((long)local_138 + lVar22) =
             *(undefined8 *)(local_458._M_local_buf + lVar22 + 0x60);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x60);
      bVar27 = 1;
      lVar22 = 0;
      ival = (IVal *)local_1a8;
      do {
        uStackY_5f0 = 0x8e4528;
        bVar16 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                           (ival,pMVar15[lVar23].m_data.m_data + lVar22);
        lVar22 = 1;
        bVar13 = bVar27 & bVar16;
        bVar27 = 0;
        ival = (IVal *)(local_1a8 + 0x60);
      } while (bVar13 != 0);
      uStackY_5f0 = 0x8e456b;
      local_468._0_8_ = &local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      uStackY_5f0 = 0x8e457e;
      bVar16 = tcu::ResultCollector::check(&local_1f8,bVar16,(string *)local_468);
      pFVar26 = local_590;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._0_8_ != &local_458) {
        uStackY_5f0 = 0x8e45a5;
        operator_delete((void *)local_468._0_8_,
                        CONCAT44(local_458._M_allocated_capacity._4_4_,
                                 local_458._M_allocated_capacity._0_4_) + 1);
      }
      if ((!bVar16) && (uVar18 = (int)local_5a8 + 1, local_5a8 = (ulong)uVar18, (int)uVar18 < 0x65))
      {
        local_468._0_8_ = local_5b8;
        poVar4 = (ostringstream *)(local_468 + 8);
        uStackY_5f0 = 0x8e45df;
        std::__cxx11::ostringstream::ostringstream(poVar4);
        uStackY_5f0 = 0x8e45f3;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
        uStackY_5f0 = 0x8e4607;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        uStackY_5f0 = 0x8e461b;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar11 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.
                  m_ptr;
        paVar24 = &local_550;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        uStackY_5f0 = 0x8e464a;
        local_560._0_8_ = paVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        uStackY_5f0 = 0x8e466a;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_560._0_8_,
                   CONCAT44(local_560._12_4_,local_560._8_4_));
        uStackY_5f0 = 0x8e467e;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        uStackY_5f0 = 0x8e4699;
        valueToString<tcu::Matrix<float,4,2>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar23),
                   (Matrix<float,_4,_2> *)paVar24);
        uStackY_5f0 = 0x8e46b2;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),_Var29._M_p,0)
        ;
        uStackY_5f0 = 0x8e46c6;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var29._M_p != &local_5d8) {
          uStackY_5f0 = 0x8e46e1;
          operator_delete(_Var29._M_p,local_5d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._0_8_ != &local_550) {
          uStackY_5f0 = 0x8e4706;
          operator_delete((void *)local_560._0_8_,(ulong)(local_550._M_allocated_capacity + 1));
        }
        uStackY_5f0 = 0x8e471f;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar11 = (this->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.
                  m_ptr;
        paVar24 = &local_550;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        uStackY_5f0 = 0x8e474e;
        local_560._0_8_ = paVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        uStackY_5f0 = 0x8e476e;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_560._0_8_,
                   CONCAT44(local_560._12_4_,local_560._8_4_));
        uStackY_5f0 = 0x8e4782;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        uStackY_5f0 = 0x8e479d;
        valueToString<tcu::Matrix<float,4,2>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in1.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar23),
                   (Matrix<float,_4,_2> *)paVar24);
        uStackY_5f0 = 0x8e47b6;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),_Var29._M_p,0)
        ;
        uStackY_5f0 = 0x8e47ca;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var29._M_p != &local_5d8) {
          uStackY_5f0 = 0x8e47e5;
          operator_delete(_Var29._M_p,local_5d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._0_8_ != &local_550) {
          uStackY_5f0 = 0x8e480a;
          operator_delete((void *)local_560._0_8_,(ulong)(local_550._M_allocated_capacity + 1));
        }
        uStackY_5f0 = 0x8e4823;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar11 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.
                  m_ptr;
        paVar24 = &local_550;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        uStackY_5f0 = 0x8e4852;
        local_560._0_8_ = paVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        uStackY_5f0 = 0x8e4872;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_560._0_8_,
                   CONCAT44(local_560._12_4_,local_560._8_4_));
        uStackY_5f0 = 0x8e4886;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        uStackY_5f0 = 0x8e48a1;
        valueToString<tcu::Matrix<float,4,2>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar23),
                   (Matrix<float,_4,_2> *)paVar24);
        poVar6 = (ostream *)(local_468 + 8);
        uStackY_5f0 = 0x8e48ba;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,_Var29._M_p,0);
        uStackY_5f0 = 0x8e48ce;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        uStackY_5f0 = 0x8e48e2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tExpected range: ",0x11);
        uStackY_5f0 = 0x8e48fc;
        intervalToString<tcu::Matrix<float,4,2>>
                  (&local_580,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1a8,(IVal *)paVar24)
        ;
        uStackY_5f0 = 0x8e490e;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_580._M_dataplus._M_p,local_580._M_string_length);
        uStackY_5f0 = 0x8e4922;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          uStackY_5f0 = 0x8e493e;
          operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var29._M_p != &local_5d8) {
          uStackY_5f0 = 0x8e4959;
          operator_delete(_Var29._M_p,local_5d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._0_8_ != &local_550) {
          uStackY_5f0 = 0x8e497e;
          operator_delete((void *)local_560._0_8_,(ulong)(local_550._M_allocated_capacity + 1));
        }
        uStackY_5f0 = 0x8e499a;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        uStackY_5f0 = 0x8e49a9;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
        uStackY_5f0 = 0x8e49b6;
        std::ios_base::~ios_base(local_3f8 + 8);
      }
      local_5a0 = local_5a0 + 1;
      local_588 = local_588 + 0x20;
    } while (local_5a0 != local_4a0);
    iVar17 = (int)local_5a8;
    if (iVar17 < 0x65) {
      if (iVar17 == 0) goto LAB_008e4be8;
    }
    else {
      poVar4 = (ostringstream *)(local_468 + 8);
      local_468._0_8_ = local_5b8;
      uStackY_5f0 = 0x8e4a0a;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      uStackY_5f0 = 0x8e4a1e;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      uStackY_5f0 = 0x8e4a29;
      std::ostream::operator<<(poVar4,iVar17 + -100);
      uStackY_5f0 = 0x8e4a3d;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      uStackY_5f0 = 0x8e4a51;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      uStackY_5f0 = 0x8e4a60;
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      uStackY_5f0 = 0x8e4a6d;
      std::ios_base::~ios_base(local_3f8 + 8);
    }
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_5b8;
    uStackY_5f0 = 0x8e4a90;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    uStackY_5f0 = 0x8e4a9a;
    std::ostream::operator<<(poVar4,iVar17);
    uStackY_5f0 = 0x8e4aae;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    uStackY_5f0 = 0x8e4abb;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    uStackY_5f0 = 0x8e4acf;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    uStackY_5f0 = 0x8e4ae3;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    uStackY_5f0 = 0x8e4af2;
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    uStackY_5f0 = 0x8e4aff;
    std::ios_base::~ios_base(local_3f8 + 8);
    uStackY_5f0 = 0x8e4b0c;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    uStackY_5f0 = 0x8e4b1b;
    std::ostream::operator<<(local_468,iVar17);
    pTVar28 = local_598;
    uStackY_5f0 = 0x8e4b35;
    std::__cxx11::stringbuf::str();
    uStackY_5f0 = 0x8e4b49;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    uStackY_5f0 = 0x8e4b59;
    std::ios_base::~ios_base(local_3f8);
    uStackY_5f0 = 0x8e4b78;
    local_468._0_8_ = &local_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)
             (CONCAT44(YStack_45c,local_468._8_4_) + CONCAT44(local_560._12_4_,local_560._8_4_));
    uVar19 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._0_8_ != &local_550) {
      uVar19 = local_550._M_allocated_capacity;
    }
    if ((ulong)uVar19 < p_Var3) {
      p_Var25 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._0_8_ != &local_458) {
        p_Var25 = (_Base_ptr)
                  CONCAT44(local_458._M_allocated_capacity._4_4_,
                           local_458._M_allocated_capacity._0_4_);
      }
      if (p_Var25 < p_Var3) goto LAB_008e4bd6;
      uStackY_5f0 = 0x8e4cec;
      puVar21 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,local_560._0_8_);
    }
    else {
LAB_008e4bd6:
      uStackY_5f0 = 0x8e4be3;
      puVar21 = (undefined8 *)std::__cxx11::string::_M_append(local_560,local_468._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar21 + 2);
    if ((double *)*puVar21 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar21 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar21 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar21;
    }
    local_1a8._8_8_ = puVar21[1];
    *puVar21 = pdVar1;
    puVar21[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar28->m_code = QP_TEST_RESULT_FAIL;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    uStackY_5f0 = 0x8e4d6a;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      uStackY_5f0 = 0x8e4d8b;
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ != &local_458) {
      uStackY_5f0 = 0x8e4da8;
      operator_delete((void *)local_468._0_8_,
                      CONCAT44(local_458._M_allocated_capacity._4_4_,
                               local_458._M_allocated_capacity._0_4_) + 1);
    }
    uVar19 = local_550._M_allocated_capacity;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_560._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._0_8_ == &local_550) goto LAB_008e4dcd;
  }
  uStackY_5f0 = 0x8e4dcd;
  operator_delete(paVar24,(ulong)((long)&((_Base_ptr)uVar19)->_M_color + 1));
LAB_008e4dcd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    uStackY_5f0 = 0x8e4dee;
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    uStackY_5f0 = 0x8e4e0f;
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  uStackY_5f0 = 0x8e4e1c;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_5f0 = 0x8e4e39;
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_5f0 = 0x8e4e56;
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_5f0 = 0x8e4e73;
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_5f0 = 0x8e4e90;
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_5f0 = 0x8e4ead;
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    uStackY_5f0 = 0x8e4eca;
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}